

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_data.cpp
# Opt level: O0

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::StructColumnData::GetUpdateStatistics(StructColumnData *this)

{
  bool bVar1;
  BaseStatistics *pBVar2;
  pointer pCVar3;
  long in_RSI;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> in_RDI;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> child_stats;
  idx_t i;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
  validity_stats;
  BaseStatistics stats;
  LogicalType *in_stack_fffffffffffffef8;
  BaseStatistics *in_stack_ffffffffffffff00;
  BaseStatistics *in_stack_ffffffffffffff18;
  BaseStatistics *in_stack_ffffffffffffff20;
  BaseStatistics *pBVar4;
  ColumnData *in_stack_ffffffffffffff28;
  BaseStatistics *this_00;
  undefined1 local_a8 [8];
  BaseStatistics *local_a0;
  LogicalType *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  
  this_00 = (BaseStatistics *)&stack0xffffffffffffff80;
  LogicalType::LogicalType(&in_stack_ffffffffffffff00->type,in_stack_fffffffffffffef8);
  BaseStatistics::CreateEmpty(in_stack_ffffffffffffff68);
  LogicalType::~LogicalType((LogicalType *)0xbba658);
  ColumnData::GetUpdateStatistics(in_stack_ffffffffffffff28);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                      *)0xbba67a);
  if (bVar1) {
    unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::operator*
              ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                *)in_stack_ffffffffffffff00);
    BaseStatistics::Merge(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  local_a0 = (BaseStatistics *)0x0;
  while (pBVar4 = local_a0,
        pBVar2 = (BaseStatistics *)
                 ::std::
                 vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                 ::size((vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                         *)(in_RSI + 0x110)), pBVar4 < pBVar2) {
    vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_true>
    ::operator[]((vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_true>
                  *)in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
    pCVar3 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
             operator->((unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>
                         *)in_stack_ffffffffffffff00);
    (*pCVar3->_vptr_ColumnData[0x19])(local_a8);
    bVar1 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
                        *)0xbba77b);
    if (bVar1) {
      in_stack_ffffffffffffff00 = local_a0;
      unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
      unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)local_a0,
                 (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)in_stack_fffffffffffffef8);
      StructStats::SetChildStats
                ((BaseStatistics *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                 (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                  *)in_stack_ffffffffffffffb0);
      unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
      ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                   *)0xbba7c2);
    }
    unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
    ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                 *)0xbba7f5);
    local_a0 = (BaseStatistics *)&(local_a0->type).physical_type_;
  }
  BaseStatistics::ToUnique(this_00);
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::~unique_ptr
            ((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              *)0xbba826);
  BaseStatistics::~BaseStatistics(in_stack_ffffffffffffff00);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
         .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<BaseStatistics> StructColumnData::GetUpdateStatistics() {
	// check if any child column has updates
	auto stats = BaseStatistics::CreateEmpty(type);
	auto validity_stats = validity.GetUpdateStatistics();
	if (validity_stats) {
		stats.Merge(*validity_stats);
	}
	for (idx_t i = 0; i < sub_columns.size(); i++) {
		auto child_stats = sub_columns[i]->GetUpdateStatistics();
		if (child_stats) {
			StructStats::SetChildStats(stats, i, std::move(child_stats));
		}
	}
	return stats.ToUnique();
}